

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O3

void text_save(t_gobj *z,_binbuf *b)

{
  int iVar1;
  t_symbol *ptVar2;
  t_symbol *ptVar3;
  t_symbol *ptVar4;
  t_symbol *ptVar5;
  t_symbol *ptVar6;
  t_gotfn p_Var7;
  char *pcVar8;
  char *s;
  
  switch(*(byte *)((long)&z[2].g_next + 6) & 3) {
  case 0:
    ptVar2 = gensym("#X");
    pcVar8 = "text";
    break;
  case 1:
    ptVar2 = gensym("saveto");
    p_Var7 = zgetfn(&z->g_pd,ptVar2);
    if ((p_Var7 == (t_gotfn)0x0) ||
       ((z->g_pd == canvas_class &&
        ((iVar1 = canvas_isabstraction((_glist *)z), iVar1 != 0 ||
         (iVar1 = canvas_istable((_glist *)z), iVar1 != 0)))))) {
      ptVar2 = gensym("#X");
      ptVar3 = gensym("obj");
      binbuf_addv(b,"ssii",ptVar2,ptVar3,(ulong)(uint)(int)*(short *)&z[2].g_next,
                  (ulong)(uint)(int)*(short *)((long)&z[2].g_next + 2));
      binbuf_addbinbuf(b,(_binbuf *)z[1].g_pd);
      if (*(short *)((long)&z[2].g_next + 4) != 0) {
        ptVar2 = gensym("f");
        binbuf_addv(b,",si",ptVar2,(ulong)(uint)(int)*(short *)((long)&z[2].g_next + 4));
      }
      binbuf_addv(b,";");
    }
    else {
      ptVar2 = gensym("saveto");
      p_Var7 = getfn(&z->g_pd,ptVar2);
      (*p_Var7)(z,b);
      ptVar2 = gensym("#X");
      ptVar3 = gensym("restore");
      binbuf_addv(b,"ssii",ptVar2,ptVar3,(ulong)(uint)(int)*(short *)&z[2].g_next,
                  (ulong)(uint)(int)*(short *)((long)&z[2].g_next + 2));
      binbuf_addbinbuf(b,(_binbuf *)z[1].g_pd);
      binbuf_addv(b,";");
      if (*(short *)((long)&z[2].g_next + 4) != 0) {
        ptVar2 = gensym("#X");
        ptVar3 = gensym("f");
        binbuf_addv(b,"ssi;",ptVar2,ptVar3,(ulong)(uint)(int)*(short *)((long)&z[2].g_next + 4));
      }
    }
    if (z->g_pd != canvas_class) {
      return;
    }
    iVar1 = canvas_isabstraction((_glist *)z);
    if (iVar1 == 0) {
      return;
    }
    canvas_statesavers_doit((_glist *)z,b);
    return;
  case 2:
    ptVar2 = gensym("#X");
    pcVar8 = "msg";
    break;
  case 3:
    pcVar8 = "listbox";
    if (*(int *)&z[3].g_pd == 1) {
      pcVar8 = "floatatom";
    }
    s = "symbolatom";
    if (*(int *)&z[3].g_pd != 2) {
      s = pcVar8;
    }
    ptVar2 = gensym(s);
    ptVar3 = gatom_escapit((t_symbol *)z[5].g_pd);
    ptVar4 = gatom_escapit((t_symbol *)z[5].g_next);
    ptVar5 = gatom_escapit((t_symbol *)z[6].g_pd);
    ptVar6 = gensym("#X");
    binbuf_addv(b,"ssiiifffsssf;",(double)*(float *)&z[4].g_next,
                (double)*(float *)((long)&z[4].g_pd + 4),(double)(*(byte *)&z[7].g_next >> 1 & 3),
                (double)*(int *)((long)&z[7].g_pd + 4),ptVar6,ptVar2,
                (ulong)(uint)(int)*(short *)&z[2].g_next,
                (ulong)(uint)(int)*(short *)((long)&z[2].g_next + 2),
                (ulong)(uint)(int)*(short *)((long)&z[2].g_next + 4),ptVar3,ptVar4,ptVar5);
    return;
  }
  ptVar3 = gensym(pcVar8);
  binbuf_addv(b,"ssii",ptVar2,ptVar3,(ulong)(uint)(int)*(short *)&z[2].g_next,
              (ulong)(uint)(int)*(short *)((long)&z[2].g_next + 2));
  binbuf_addbinbuf(b,(_binbuf *)z[1].g_pd);
  if (*(short *)((long)&z[2].g_next + 4) != 0) {
    ptVar2 = gensym("f");
    binbuf_addv(b,",si",ptVar2,(ulong)(uint)(int)*(short *)((long)&z[2].g_next + 4));
  }
  binbuf_addv(b,";");
  return;
}

Assistant:

void text_save(t_gobj *z, t_binbuf *b)
{
    t_text *x = (t_text *)z;
    if (x->te_type == T_OBJECT)
    {
            /* if we have a "saveto" method, and if we don't happen to be
            a canvas that's an abstraction, the saveto method does the work */
        if (zgetfn(&x->te_pd, gensym("saveto")) &&
            !((pd_class(&x->te_pd) == canvas_class) &&
                (canvas_isabstraction((t_canvas *)x)
                    || canvas_istable((t_canvas *)x))))
        {
            mess1(&x->te_pd, gensym("saveto"), b);
            binbuf_addv(b, "ssii", gensym("#X"), gensym("restore"),
                (int)x->te_xpix, (int)x->te_ypix);
            binbuf_addbinbuf(b, x->te_binbuf);
            binbuf_addv(b, ";");
            if (x->te_width)
                binbuf_addv(b, "ssi;",
                    gensym("#X"), gensym("f"), (int)x->te_width);
        }
        else    /* otherwise just save the text */
        {
            binbuf_addv(b, "ssii", gensym("#X"), gensym("obj"),
                (int)x->te_xpix, (int)x->te_ypix);
            binbuf_addbinbuf(b, x->te_binbuf);
            if (x->te_width)
                binbuf_addv(b, ",si", gensym("f"), (int)x->te_width);
            binbuf_addv(b, ";");
        }
            /* if an abstraction, give it a chance to save state */
        if (pd_class(&x->te_pd) == canvas_class &&
            canvas_isabstraction((t_canvas *)x))
                canvas_statesavers_doit((t_glist *)x, b);
    }
    else if (x->te_type == T_MESSAGE)
    {
        binbuf_addv(b, "ssii", gensym("#X"), gensym("msg"),
            (int)x->te_xpix, (int)x->te_ypix);
        binbuf_addbinbuf(b, x->te_binbuf);
        if (x->te_width)
            binbuf_addv(b, ",si", gensym("f"), (int)x->te_width);
        binbuf_addv(b, ";");
    }
    else if (x->te_type == T_ATOM)
    {
        t_atomtype t = ((t_gatom *)x)->a_flavor;
        t_symbol *sel = (t == A_SYMBOL ? gensym("symbolatom") :
            (t == A_FLOAT ? gensym("floatatom") : gensym("listbox")));
        t_symbol *label = gatom_escapit(((t_gatom *)x)->a_label);
        t_symbol *symfrom = gatom_escapit(((t_gatom *)x)->a_symfrom);
        t_symbol *symto = gatom_escapit(((t_gatom *)x)->a_symto);
        binbuf_addv(b, "ssiiifffsssf;", gensym("#X"), sel,
            (int)x->te_xpix, (int)x->te_ypix, (int)x->te_width,
            (double)((t_gatom *)x)->a_draglo,
            (double)((t_gatom *)x)->a_draghi,
            (double)((t_gatom *)x)->a_wherelabel,
            label, symfrom, symto, (double)((t_gatom *)x)->a_fontsize);
    }
    else
    {
        binbuf_addv(b, "ssii", gensym("#X"), gensym("text"),
            (int)x->te_xpix, (int)x->te_ypix);
        binbuf_addbinbuf(b, x->te_binbuf);
        if (x->te_width)
            binbuf_addv(b, ",si", gensym("f"), (int)x->te_width);
        binbuf_addv(b, ";");
    }
}